

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

string * __thiscall
mocker::ir::Interpreter::deleteComments
          (string *__return_storage_ptr__,Interpreter *this,string *source)

{
  char *pcVar1;
  Iter end;
  Interpreter *this_00;
  Iter iter;
  Iter IVar2;
  Interpreter *local_50 [2];
  pointer local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = (Interpreter *)source;
  std::__cxx11::string::push_back((char)source);
  if (source->_M_string_length != 0) {
    iter._M_current = (source->_M_dataplus)._M_p;
    end._M_current = iter._M_current + source->_M_string_length;
    do {
      if (*iter._M_current == '\"') {
        IVar2 = readStringLiteral(this_00,iter,end);
        local_50[0] = (Interpreter *)&stack0xffffffffffffffc0;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_50,iter._M_current,IVar2._M_current);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        this_00 = local_50[0];
        if (local_50[0] != (Interpreter *)&stack0xffffffffffffffc0) {
          operator_delete(local_50[0],(ulong)((long)&(local_40->label)._M_dataplus._M_p + 1));
        }
      }
      else if (*iter._M_current == ';') {
        do {
          IVar2._M_current = iter._M_current + 1;
          pcVar1 = iter._M_current + 1;
          iter._M_current = IVar2._M_current;
        } while (*pcVar1 != '\n');
      }
      else {
        this_00 = (Interpreter *)__return_storage_ptr__;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        IVar2._M_current = iter._M_current + 1;
      }
      end._M_current = (source->_M_dataplus)._M_p + source->_M_string_length;
      iter._M_current = IVar2._M_current;
    } while (IVar2._M_current != end._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::deleteComments(std::string source) const {
  std::string res;

  source.push_back('\n');
  auto iter = source.cbegin();
  while (iter != source.end()) {
    if (*iter == '\"') {
      auto strEnd = readStringLiteral(iter, source.end());
      res += std::string(iter, strEnd);
      iter = strEnd;
      continue;
    }
    if (*iter != ';') {
      res.push_back(*iter);
      ++iter;
      continue;
    }
    while (*iter != '\n')
      ++iter;
  }

  return res;
}